

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int executeExternalCommand
              (string *command,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  pointer pbVar1;
  StringRef RHS;
  undefined1 auVar2 [16];
  Optional<llvm::ArrayRef<llvm::StringRef>_> Env;
  FILE *__stream;
  bool bVar3;
  int iVar4;
  storage_type *psVar5;
  char *pcVar6;
  size_t sVar7;
  Style in_ECX;
  pointer ppcVar8;
  ulong in_R9;
  pointer pSVar9;
  pointer ppcVar10;
  pointer pbVar11;
  StringRef SVar12;
  error_code eVar13;
  StringRef Name;
  ArrayRef<llvm::StringRef> Args;
  StringRef Program;
  vector<char_*,_std::allocator<char_*>_> argsAsCStrings;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> argRefs;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  uint7 uStack_197;
  Twine local_190;
  Twine local_178;
  string local_160;
  SmallString<256U> SubcommandPath;
  
  std::__cxx11::string::string((string *)&local_160,(string *)command);
  getExecutablePath((string *)&argRefs,&local_160);
  SVar12.Length = 2;
  SVar12.Data = (char *)argRefs.
                        super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
  SVar12 = llvm::sys::path::parent_path
                     ((path *)argRefs.
                              super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                              _M_impl.super__Vector_impl_data._M_start,SVar12,in_ECX);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&SubcommandPath.super_SmallVector<char,_256U>,SVar12.Data,SVar12.Data + SVar12.Length);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  llvm::Twine::Twine((Twine *)&argRefs,command);
  llvm::Twine::Twine((Twine *)&argsAsCStrings,"");
  llvm::Twine::Twine(&local_190,"");
  llvm::Twine::Twine(&local_178,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&SubcommandPath,(Twine *)&argRefs,(Twine *)&argsAsCStrings,
             &local_190,&local_178);
  llvm::Twine::Twine((Twine *)&argRefs,(SmallVectorImpl<char> *)&SubcommandPath);
  bVar3 = llvm::sys::fs::exists((Twine *)&argRefs);
  if (!bVar3) {
    Name.Length = 0;
    Name.Data = (char *)command->_M_string_length;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = in_R9;
    llvm::sys::findProgramByName_abi_cxx11_
              ((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&argRefs,(sys *)(command->_M_dataplus)._M_p,Name,
               (ArrayRef<llvm::StringRef>)(auVar2 << 0x40));
    eVar13 = llvm::
             ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::getError((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&argRefs);
    __stream = _stderr;
    if (eVar13._M_value == 0) {
      psVar5 = llvm::
               ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::getStorage((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&argRefs);
      RHS.Data = (psVar5->_M_dataplus)._M_p;
      RHS.Length = psVar5->_M_string_length;
      llvm::SmallString<256U>::operator=(&SubcommandPath,RHS);
    }
    else {
      pcVar6 = llbuild::commands::getProgramName();
      fprintf(__stream,"error: %s: unknown command \'%s\'\n",pcVar6,(command->_M_dataplus)._M_p);
    }
    llvm::ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~ErrorOr((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&argRefs);
    if (eVar13._M_value != 0) {
      iVar4 = -1;
      goto LAB_00115c26;
    }
  }
  std::vector<char_*,_std::allocator<char_*>_>::vector
            (&argsAsCStrings,
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&argRefs);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ppcVar8 = argsAsCStrings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (pbVar11 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar1;
      pbVar11 = pbVar11 + 1) {
    std::__cxx11::string::string((string *)&argRefs,(string *)pbVar11);
    pcVar6 = strdup((char *)argRefs.
                            super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    *ppcVar8 = pcVar6;
    std::__cxx11::string::_M_dispose();
    ppcVar8 = ppcVar8 + 1;
  }
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::vector
            (&argRefs,(long)argsAsCStrings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)argsAsCStrings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)&local_190);
  ppcVar8 = argsAsCStrings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pSVar9 = argRefs.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (ppcVar10 = argsAsCStrings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppcVar10 != ppcVar8; ppcVar10 = ppcVar10 + 1) {
    pcVar6 = *ppcVar10;
    if (pcVar6 == (char *)0x0) {
      sVar7 = 0;
    }
    else {
      sVar7 = strlen(pcVar6);
    }
    pSVar9->Data = pcVar6;
    pSVar9->Length = sVar7;
    pSVar9 = pSVar9 + 1;
  }
  Args.Length = (long)argRefs.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)argRefs.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4;
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer._8_8_ = uStack_1a0;
  Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer._0_8_ = local_1a8;
  Env.Storage._16_8_ = (ulong)uStack_197 << 8;
  Args.Data = argRefs.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
              super__Vector_impl_data._M_start;
  Program.Length._4_4_ = 0;
  Program._0_12_ =
       SubcommandPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase._0_12_;
  iVar4 = llvm::sys::ExecuteAndWait
                    (Program,Args,Env,(ArrayRef<llvm::Optional<llvm::StringRef>_>)ZEXT816(0),0,0,
                     (string *)0x0,(bool *)0x0);
  for (ppcVar8 = argsAsCStrings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar8 !=
      argsAsCStrings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar8 = ppcVar8 + 1) {
    free(*ppcVar8);
  }
  std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
            (&argRefs.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>);
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            (&argsAsCStrings.super__Vector_base<char_*,_std::allocator<char_*>_>);
LAB_00115c26:
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&SubcommandPath);
  return iVar4;
}

Assistant:

int executeExternalCommand(std::string command, std::vector<std::string> args) {
  // We are running as a subcommand, try to find the subcommand adjacent to
  // the executable we are running as.
  SmallString<256> SubcommandPath(
                                  llvm::sys::path::parent_path(getExecutablePath(command)));
  llvm::sys::path::append(SubcommandPath, command);
  
  // If we didn't find the tool there, let the OS search for it.
  if (!llvm::sys::fs::exists(SubcommandPath)) {
    // Search for the program and use the path if found.
    auto result = llvm::sys::findProgramByName(command);
    if (!result.getError()) {
      SubcommandPath = *result;
    } else {
      fprintf(stderr, "error: %s: unknown command '%s'\n", getProgramName(),
              command.c_str());
      return -1;
    }
  }
  
  std::vector<char*> argsAsCStrings(args.size());
  std::transform(args.begin(), args.end(), argsAsCStrings.begin(), [](std::string element) { return strdup(element.c_str()); });
  std::vector<StringRef> argRefs(argsAsCStrings.size());
  std::transform(argsAsCStrings.begin(), argsAsCStrings.end(), argRefs.begin(), [](char *element) { return StringRef(element); });
  // Actually execute the command and wait for it to finish
  int exitStatus = llvm::sys::ExecuteAndWait(StringRef(SubcommandPath), ArrayRef<StringRef>(argRefs));
  
  for (auto cString: argsAsCStrings) {
    free(cString);
  }
  
  return exitStatus;
}